

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall FailableMemoryAllocator::checkAllFailedAllocsWereDone(FailableMemoryAllocator *this)

{
  size_t test;
  char *fileName;
  size_t lineNumber;
  undefined1 local_d0 [120];
  SimpleString local_58 [2];
  SimpleString local_38;
  undefined1 local_28 [8];
  SimpleString failText;
  UtestShell *currentTest;
  FailableMemoryAllocator *this_local;
  
  if (this->head_ != (LocationToFailAllocNode *)0x0) {
    failText.bufferSize_ = (size_t)UtestShell::getCurrent();
    SimpleString::SimpleString((SimpleString *)local_28,"");
    if (this->head_->file_ == (char *)0x0) {
      StringFromFormat((char *)local_58,"Expected allocation number %d was never done",
                       (ulong)(uint)this->head_->allocNumberToFail_);
      SimpleString::operator=((SimpleString *)local_28,local_58);
      SimpleString::~SimpleString(local_58);
    }
    else {
      StringFromFormat((char *)&local_38,"Expected failing alloc at %s:%d was never done",
                       this->head_->file_,(ulong)(uint)this->head_->line_);
      SimpleString::operator=((SimpleString *)local_28,&local_38);
      SimpleString::~SimpleString(&local_38);
    }
    test = failText.bufferSize_;
    UtestShell::getName((UtestShell *)local_d0);
    fileName = SimpleString::asCharString((SimpleString *)local_d0);
    lineNumber = UtestShell::getLineNumber((UtestShell *)failText.bufferSize_);
    FailFailure::FailFailure
              ((FailFailure *)(local_d0 + 0x10),(UtestShell *)test,fileName,lineNumber,
               (SimpleString *)local_28);
    (**(code **)(*(long *)test + 0x130))(test,local_d0 + 0x10);
    FailFailure::~FailFailure((FailFailure *)(local_d0 + 0x10));
    SimpleString::~SimpleString((SimpleString *)local_d0);
    SimpleString::~SimpleString((SimpleString *)local_28);
  }
  return;
}

Assistant:

void FailableMemoryAllocator::checkAllFailedAllocsWereDone()
{
    if (head_) {
        UtestShell* currentTest = UtestShell::getCurrent();
        SimpleString failText;
        if (head_->file_)
            failText = StringFromFormat("Expected failing alloc at %s:%d was never done", head_->file_, (int) head_->line_);
        else
            failText = StringFromFormat("Expected allocation number %d was never done", (int) head_->allocNumberToFail_);

        currentTest->failWith(FailFailure(currentTest, currentTest->getName().asCharString(), currentTest->getLineNumber(), failText));
    }
}